

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O1

string * str_xor(string *__return_storage_ptr__,string *s,char *t)

{
  size_type sVar1;
  ulong uVar2;
  byte *pbVar3;
  byte *pbVar4;
  
  sVar1 = s->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)sVar1);
  if (s->_M_string_length != 0) {
    uVar2 = 0;
    pbVar4 = (byte *)t;
    do {
      pbVar3 = (byte *)t;
      if (*pbVar4 != 0) {
        pbVar3 = pbVar4;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar2] = *pbVar3 ^ (s->_M_dataplus)._M_p[uVar2];
      uVar2 = uVar2 + 1;
      pbVar4 = pbVar3 + 1;
    } while (uVar2 < s->_M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str_xor (const std::string& s, const char* t)
{
    const char* pc = t;
    std::string r ( s.size(), '\0');
    for (size_t i = 0; i < s.size(); ++i, ++pc) {
        if (!(*pc)) pc = t;                     // restart at end of string
        r[i] = s[i] ^ *pc;
    }
    return r;
}